

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

uint prvTidyNodeAttributeVersions(Node *node,TidyAttrId id)

{
  AttrVersion *pAVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  if (((node != (Node *)0x0) && (uVar3 = 0, node->tag != (Dict *)0x0)) &&
     (pAVar1 = node->tag->attrvers, pAVar1 != (AttrVersion *)0x0)) {
    uVar2 = 0;
    do {
      uVar4 = uVar2;
      if (pAVar1[uVar4].attribute == TidyAttr_UNKNOWN) {
        return 0;
      }
      uVar2 = (ulong)((int)uVar4 + 1);
    } while (pAVar1[uVar4].attribute != id);
    uVar3 = pAVar1[uVar4].versions;
  }
  return uVar3;
}

Assistant:

uint TY_(NodeAttributeVersions)( Node* node, TidyAttrId id )
{
    uint i;

    if (!node || !node->tag || !node->tag->attrvers)
        return VERS_UNKNOWN;

    for (i = 0; node->tag->attrvers[i].attribute; ++i)
        if (node->tag->attrvers[i].attribute == id)
            return node->tag->attrvers[i].versions;

    return VERS_UNKNOWN;
}